

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::anon_unknown_1::ConsoleAssertionPrinter::printOriginalExpression
          (ConsoleAssertionPrinter *this)

{
  bool bVar1;
  AssertionResult *in_RDI;
  Colour colourGuard;
  Code in_stack_ffffffffffffffac;
  Colour *in_stack_ffffffffffffffb0;
  ostream *poVar2;
  string local_40 [56];
  AssertionResult *this_00;
  
  this_00 = in_RDI;
  bVar1 = AssertionResult::hasExpression((AssertionResult *)0x158e1c);
  if (bVar1) {
    Colour::Colour(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
    std::operator<<((ostream *)(in_RDI->m_info).macroName.m_start,"  ");
    poVar2 = (ostream *)(in_RDI->m_info).macroName.m_start;
    AssertionResult::getExpressionInMacro_abi_cxx11_(this_00);
    std::operator<<(poVar2,local_40);
    std::__cxx11::string::~string(local_40);
    std::operator<<((ostream *)(in_RDI->m_info).macroName.m_start,'\n');
    Colour::~Colour((Colour *)0x158ea0);
  }
  return;
}

Assistant:

void printOriginalExpression() const {
        if (result.hasExpression()) {
            Colour colourGuard(Colour::OriginalExpression);
            stream << "  ";
            stream << result.getExpressionInMacro();
            stream << '\n';
        }
    }